

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O0

void __thiscall
asio::detail::
read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
::operator()(read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  unsigned_long *__b;
  int in_ECX;
  long in_RDX;
  error_code *in_RSI;
  long in_RDI;
  size_t bytes_available;
  size_t max_size;
  error_code *in_stack_ffffffffffffff48;
  read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
  *in_stack_ffffffffffffff50;
  mutable_buffers_1 *in_stack_ffffffffffffff58;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>
  *in_stack_ffffffffffffff60;
  unsigned_long local_70;
  unsigned_long local_68 [2];
  undefined1 in_stack_ffffffffffffffa8 [16];
  anon_class_8_1_8991fb9c_for_handler_ *in_stack_ffffffffffffffb8;
  unsigned_long local_40 [3];
  size_t local_28 [2];
  long local_18;
  error_code *local_10;
  
  *(int *)(in_RDI + 0x18) = in_ECX;
  if (in_ECX == 1) {
    local_28[0] = base_from_completion_cond<asio::detail::transfer_exactly_t>::check_for_completion
                            (&in_stack_ffffffffffffff50->
                              super_base_from_completion_cond<asio::detail::transfer_exactly_t>,
                             in_stack_ffffffffffffff48,0x1abe6e);
    local_40[1] = 0x200;
    sVar2 = basic_streambuf_ref<std::allocator<char>_>::capacity
                      ((basic_streambuf_ref<std::allocator<char>_> *)0x1abe90);
    sVar3 = basic_streambuf_ref<std::allocator<char>_>::size
                      ((basic_streambuf_ref<std::allocator<char>_> *)0x1abea3);
    local_40[0] = sVar2 - sVar3;
    puVar4 = std::max<unsigned_long>(local_40 + 1,local_40);
    basic_streambuf_ref<std::allocator<char>_>::max_size
              ((basic_streambuf_ref<std::allocator<char>_> *)0x1abed8);
    basic_streambuf_ref<std::allocator<char>_>::size
              ((basic_streambuf_ref<std::allocator<char>_> *)0x1abeeb);
    __b = std::min<unsigned_long>(local_28,(unsigned_long *)&stack0xffffffffffffffb8);
    puVar4 = std::min<unsigned_long>(puVar4,__b);
    local_40[2] = *puVar4;
  }
  else {
    *(long *)(in_RDI + 0x20) = in_RDX + *(long *)(in_RDI + 0x20);
    local_18 = in_RDX;
    local_10 = in_RSI;
    basic_streambuf_ref<std::allocator<char>_>::commit
              ((basic_streambuf_ref<std::allocator<char>_> *)in_stack_ffffffffffffff50,
               (size_t)in_stack_ffffffffffffff48);
    local_28[0] = base_from_completion_cond<asio::detail::transfer_exactly_t>::check_for_completion
                            (&in_stack_ffffffffffffff50->
                              super_base_from_completion_cond<asio::detail::transfer_exactly_t>,
                             in_stack_ffffffffffffff48,0x1abfa9);
    local_68[1] = 0x200;
    in_stack_ffffffffffffff50 =
         (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
          *)basic_streambuf_ref<std::allocator<char>_>::capacity
                      ((basic_streambuf_ref<std::allocator<char>_> *)0x1abfc8);
    sVar2 = basic_streambuf_ref<std::allocator<char>_>::size
                      ((basic_streambuf_ref<std::allocator<char>_> *)0x1abfdb);
    local_68[0] = (long)in_stack_ffffffffffffff50 - sVar2;
    in_stack_ffffffffffffff60 =
         (basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *)
         std::max<unsigned_long>(local_68 + 1,local_68);
    in_stack_ffffffffffffff58 =
         (mutable_buffers_1 *)
         basic_streambuf_ref<std::allocator<char>_>::max_size
                   ((basic_streambuf_ref<std::allocator<char>_> *)0x1ac00d);
    sVar2 = basic_streambuf_ref<std::allocator<char>_>::size
                      ((basic_streambuf_ref<std::allocator<char>_> *)0x1ac020);
    local_70 = (long)in_stack_ffffffffffffff58 - sVar2;
    puVar4 = std::min<unsigned_long>(local_28,&local_70);
    puVar4 = std::min<unsigned_long>((unsigned_long *)in_stack_ffffffffffffff60,puVar4);
    local_40[2] = *puVar4;
    bVar1 = std::error_code::operator_cast_to_bool(local_10);
    if (((!bVar1) && (local_18 == 0)) || (local_40[2] == 0)) {
      anon_class_8_1_8991fb9c_for_handler_::operator()
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8._8_8_,
                 in_stack_ffffffffffffffa8._0_8_);
      return;
    }
  }
  basic_streambuf_ref<std::allocator<char>_>::prepare
            ((basic_streambuf_ref<std::allocator<char>_> *)in_stack_ffffffffffffff50,
             (size_t)in_stack_ffffffffffffff48);
  basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>::
  async_read_some<asio::mutable_buffers_1,asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,asio::stream_socket_service<asio::ip::tcp>>,asio::basic_streambuf_ref<std::allocator<char>>,asio::detail::transfer_exactly_t,tonk::gateway::HTTPRequester::ContinueReadingBody()::__0>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size, bytes_available;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, total_transferred_);
        bytes_available = std::min<std::size_t>(
              std::max<std::size_t>(512,
                buffers_.capacity() - buffers_.size()),
              std::min<std::size_t>(max_size,
                buffers_.max_size() - buffers_.size()));
        for (;;)
        {
          stream_.async_read_some(buffers_.prepare(bytes_available),
              ASIO_MOVE_CAST(read_dynbuf_op)(*this));
          return; default:
          total_transferred_ += bytes_transferred;
          buffers_.commit(bytes_transferred);
          max_size = this->check_for_completion(ec, total_transferred_);
          bytes_available = std::min<std::size_t>(
                std::max<std::size_t>(512,
                  buffers_.capacity() - buffers_.size()),
                std::min<std::size_t>(max_size,
                  buffers_.max_size() - buffers_.size()));
          if ((!ec && bytes_transferred == 0) || bytes_available == 0)
            break;
        }

        handler_(ec, static_cast<const std::size_t&>(total_transferred_));
      }
    }